

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ComputeCumulativeSumRow_C(uint8_t *row,int32_t *cumsum,int32_t *previous_cumsum,int width)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  int x;
  int32_t row_sum [4];
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_1c;
  long local_18;
  long local_10;
  long local_8;
  
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_38,0,0x10);
  for (local_3c = 0; local_3c < local_1c; local_3c = local_3c + 1) {
    local_38 = (uint)*(byte *)(local_8 + (local_3c << 2)) + local_38;
    local_34 = (uint)*(byte *)(local_8 + (local_3c * 4 + 1)) + local_34;
    local_30 = (uint)*(byte *)(local_8 + (local_3c * 4 + 2)) + local_30;
    local_2c = (uint)*(byte *)(local_8 + (local_3c * 4 + 3)) + local_2c;
    *(int *)(local_10 + (long)(local_3c << 2) * 4) =
         local_38 + *(int *)(local_18 + (long)(local_3c << 2) * 4);
    *(int *)(local_10 + (long)(local_3c * 4 + 1) * 4) =
         local_34 + *(int *)(local_18 + (long)(local_3c * 4 + 1) * 4);
    *(int *)(local_10 + (long)(local_3c * 4 + 2) * 4) =
         local_30 + *(int *)(local_18 + (long)(local_3c * 4 + 2) * 4);
    *(int *)(local_10 + (long)(local_3c * 4 + 3) * 4) =
         local_2c + *(int *)(local_18 + (long)(local_3c * 4 + 3) * 4);
  }
  return;
}

Assistant:

void ComputeCumulativeSumRow_C(const uint8_t* row,
                               int32_t* cumsum,
                               const int32_t* previous_cumsum,
                               int width) {
  int32_t row_sum[4] = {0, 0, 0, 0};
  int x;
  for (x = 0; x < width; ++x) {
    row_sum[0] += row[x * 4 + 0];
    row_sum[1] += row[x * 4 + 1];
    row_sum[2] += row[x * 4 + 2];
    row_sum[3] += row[x * 4 + 3];
    cumsum[x * 4 + 0] = row_sum[0] + previous_cumsum[x * 4 + 0];
    cumsum[x * 4 + 1] = row_sum[1] + previous_cumsum[x * 4 + 1];
    cumsum[x * 4 + 2] = row_sum[2] + previous_cumsum[x * 4 + 2];
    cumsum[x * 4 + 3] = row_sum[3] + previous_cumsum[x * 4 + 3];
  }
}